

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cni.hpp
# Opt level: O0

cni_holder_base *
cs_impl::cni::construct_helper<cs::repl::repl(std::shared_ptr<cs::context_type>)::$_0>::
_construct<cs::repl::repl(std::shared_ptr<cs::context_type>)::__0&,void>
          (anon_class_1_0_00000001 *val,_func_void *target_function)

{
  cni_holder_base *pcVar1;
  _func_void *in_stack_ffffffffffffffd8;
  _func_void *in_stack_ffffffffffffffe0;
  
  check_conversion<void,void>(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
  pcVar1 = (cni_holder_base *)operator_new(0x28);
  cni_holder<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/covscript[P]covscript/sources/instance/instance.cpp:332:67),_void_(*)()>
  ::cni_holder((cni_holder<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_covscript[P]covscript_sources_instance_instance_cpp:332:67),_void_(*)()>
                *)val,(anon_class_1_0_00000001 *)target_function);
  return pcVar1;
}

Assistant:

static cni_holder_base *_construct(X &&val, RetT(*target_function)(ArgsT...))
			{
				using source_function_type = typename type_conversion_cpp<RetT>::target_type(*)(
				                                 typename type_conversion_cs<ArgsT>::source_type...);
				// Return type
				static_assert(cni_convertible<RetT, typename type_conversion_cpp<RetT>::target_type>::value,
				              "Invalid conversion.");
				// Argument type
				check_conversion(target_function, source_function_type(nullptr));
				return new cni_holder<T, source_function_type>(std::forward<X>(val));
			}